

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereAddExplainText
               (Parse *pParse,int addr,SrcList *pTabList,WhereLevel *pLevel,u16 wctrlFlags)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  sqlite3 *db;
  WhereLoop *pWVar5;
  Index *pIVar6;
  Parse *pPVar7;
  char *pcVar8;
  uint iTerm;
  uint uVar9;
  char *zFormat;
  Op *pOVar10;
  long in_FS_OFFSET;
  bool bVar11;
  undefined1 local_c8 [24];
  undefined1 *local_b0;
  char zBuf [100];
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar7 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar7 = pParse;
  }
  if (pPVar7->explain != '\x02') goto LAB_0018ea25;
  if (pParse->pVdbe->db->mallocFailed == '\0') {
    pOVar10 = pParse->pVdbe->aOp + addr;
  }
  else {
    pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  bVar1 = pLevel->iFrom;
  db = pParse->db;
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  zBuf[0x50] = -0x56;
  zBuf[0x51] = -0x56;
  zBuf[0x52] = -0x56;
  zBuf[0x53] = -0x56;
  zBuf[0x54] = -0x56;
  zBuf[0x55] = -0x56;
  zBuf[0x56] = -0x56;
  zBuf[0x57] = -0x56;
  zBuf[0x58] = -0x56;
  zBuf[0x59] = -0x56;
  zBuf[0x5a] = -0x56;
  zBuf[0x5b] = -0x56;
  zBuf[0x5c] = -0x56;
  zBuf[0x5d] = -0x56;
  zBuf[0x5e] = -0x56;
  zBuf[0x5f] = -0x56;
  zBuf[0x40] = -0x56;
  zBuf[0x41] = -0x56;
  zBuf[0x42] = -0x56;
  zBuf[0x43] = -0x56;
  zBuf[0x44] = -0x56;
  zBuf[0x45] = -0x56;
  zBuf[0x46] = -0x56;
  zBuf[0x47] = -0x56;
  zBuf[0x48] = -0x56;
  zBuf[0x49] = -0x56;
  zBuf[0x4a] = -0x56;
  zBuf[0x4b] = -0x56;
  zBuf[0x4c] = -0x56;
  zBuf[0x4d] = -0x56;
  zBuf[0x4e] = -0x56;
  zBuf[0x4f] = -0x56;
  zBuf[0x30] = -0x56;
  zBuf[0x31] = -0x56;
  zBuf[0x32] = -0x56;
  zBuf[0x33] = -0x56;
  zBuf[0x34] = -0x56;
  zBuf[0x35] = -0x56;
  zBuf[0x36] = -0x56;
  zBuf[0x37] = -0x56;
  zBuf[0x38] = -0x56;
  zBuf[0x39] = -0x56;
  zBuf[0x3a] = -0x56;
  zBuf[0x3b] = -0x56;
  zBuf[0x3c] = -0x56;
  zBuf[0x3d] = -0x56;
  zBuf[0x3e] = -0x56;
  zBuf[0x3f] = -0x56;
  zBuf[0x20] = -0x56;
  zBuf[0x21] = -0x56;
  zBuf[0x22] = -0x56;
  zBuf[0x23] = -0x56;
  zBuf[0x24] = -0x56;
  zBuf[0x25] = -0x56;
  zBuf[0x26] = -0x56;
  zBuf[0x27] = -0x56;
  zBuf[0x28] = -0x56;
  zBuf[0x29] = -0x56;
  zBuf[0x2a] = -0x56;
  zBuf[0x2b] = -0x56;
  zBuf[0x2c] = -0x56;
  zBuf[0x2d] = -0x56;
  zBuf[0x2e] = -0x56;
  zBuf[0x2f] = -0x56;
  zBuf[0x10] = -0x56;
  zBuf[0x11] = -0x56;
  zBuf[0x12] = -0x56;
  zBuf[0x13] = -0x56;
  zBuf[0x14] = -0x56;
  zBuf[0x15] = -0x56;
  zBuf[0x16] = -0x56;
  zBuf[0x17] = -0x56;
  zBuf[0x18] = -0x56;
  zBuf[0x19] = -0x56;
  zBuf[0x1a] = -0x56;
  zBuf[0x1b] = -0x56;
  zBuf[0x1c] = -0x56;
  zBuf[0x1d] = -0x56;
  zBuf[0x1e] = -0x56;
  zBuf[0x1f] = -0x56;
  zBuf[0] = -0x56;
  zBuf[1] = -0x56;
  zBuf[2] = -0x56;
  zBuf[3] = -0x56;
  zBuf[4] = -0x56;
  zBuf[5] = -0x56;
  zBuf[6] = -0x56;
  zBuf[7] = -0x56;
  zBuf[8] = -0x56;
  zBuf[9] = -0x56;
  zBuf[10] = -0x56;
  zBuf[0xb] = -0x56;
  zBuf[0xc] = -0x56;
  zBuf[0xd] = -0x56;
  zBuf[0xe] = -0x56;
  zBuf[0xf] = -0x56;
  zBuf[0x60] = -0x56;
  zBuf[0x61] = -0x56;
  zBuf[0x62] = -0x56;
  zBuf[99] = -0x56;
  if (db->mallocFailed != '\0') goto LAB_0018ea25;
  pWVar5 = pLevel->pWLoop;
  uVar9 = pWVar5->wsFlags;
  bVar11 = true;
  if (((uVar9 & 0x30) == 0) && (((uVar9 >> 10 & 1) != 0 || ((pWVar5->u).btree.nEq == 0)))) {
    bVar11 = (wctrlFlags & 3) != 0;
  }
  local_c8._8_8_ = zBuf;
  local_c8._16_4_ = 100;
  local_c8._20_4_ = 1000000000;
  local_b0 = (undefined1 *)0xaaaa010000000000;
  pcVar8 = "SCAN";
  if (bVar11) {
    pcVar8 = "SEARCH";
  }
  local_c8._0_8_ = db;
  sqlite3_str_appendf((StrAccum *)local_c8,"%s %S",pcVar8,pTabList->a + bVar1);
  if ((uVar9 & 0x500) == 0) {
    pIVar6 = (pWVar5->u).btree.pIndex;
    if ((((pTabList->a[bVar1].pSTab)->tabFlags & 0x80) == 0) ||
       ((*(ushort *)&pIVar6->field_0x63 & 3) != 2)) {
      if ((uVar9 >> 0x11 & 1) == 0) {
        if ((uVar9 >> 0xe & 1) == 0) {
          pcVar8 = "COVERING INDEX %s";
          if ((uVar9 & 0x4000040) == 0) {
            pcVar8 = "INDEX %s";
          }
        }
        else {
          pcVar8 = "AUTOMATIC COVERING INDEX";
        }
      }
      else {
        pcVar8 = "AUTOMATIC PARTIAL COVERING INDEX";
      }
    }
    else {
      if (!bVar11) goto LAB_0018e9e3;
      pcVar8 = "PRIMARY KEY";
    }
    sqlite3_str_append((sqlite3_str *)local_c8," USING ",7);
    sqlite3_str_appendf((sqlite3_str *)local_c8,pcVar8,pIVar6->zName);
    pIVar6 = (pWVar5->u).btree.pIndex;
    uVar2 = (pWVar5->u).btree.nEq;
    uVar3 = pWVar5->nSkip;
    if ((uVar2 != 0) || ((pWVar5->wsFlags & 0x30) != 0)) {
      sqlite3_str_append((sqlite3_str *)local_c8," (",2);
      for (uVar9 = 0; iTerm = (uint)uVar2, iTerm != uVar9; uVar9 = uVar9 + 1) {
        pcVar8 = explainIndexColumnName(pIVar6,uVar9);
        if (uVar9 != 0) {
          sqlite3_str_append((sqlite3_str *)local_c8," AND ",5);
        }
        zFormat = "%s=?";
        if (uVar9 < uVar3) {
          zFormat = "ANY(%s)";
        }
        sqlite3_str_appendf((sqlite3_str *)local_c8,zFormat,pcVar8);
      }
      uVar9 = pWVar5->wsFlags;
      if ((uVar9 & 0x20) != 0) {
        explainAppendTerm((StrAccum *)local_c8,pIVar6,(uint)(pWVar5->u).btree.nBtm,iTerm,iTerm,">");
        uVar9 = pWVar5->wsFlags;
        iTerm = 1;
      }
      if ((uVar9 & 0x10) != 0) {
        explainAppendTerm((StrAccum *)local_c8,pIVar6,(uint)(pWVar5->u).btree.nTop,(uint)uVar2,iTerm
                          ,"<");
      }
      sqlite3_str_append((sqlite3_str *)local_c8,")",1);
    }
  }
  else if ((uVar9 & 0xf) == 0 || (uVar9 >> 8 & 1) == 0) {
    if ((uVar9 >> 10 & 1) != 0) {
      sqlite3_str_appendall((sqlite3_str *)local_c8," VIRTUAL TABLE INDEX ");
      pcVar8 = "0x%x:%s";
      if ((undefined1  [24])((undefined1  [24])pWVar5->u & (undefined1  [24])0x400000000) ==
          (undefined1  [24])0x0) {
        pcVar8 = "%d:%s";
      }
      sqlite3_str_appendf((sqlite3_str *)local_c8,pcVar8,(ulong)(uint)(pWVar5->u).vtab.idxNum,
                          (pWVar5->u).btree.pIndex);
    }
  }
  else {
    sqlite3_str_appendf((StrAccum *)local_c8," USING INTEGER PRIMARY KEY (%s","rowid");
    if ((uVar9 & 5) == 0) {
      if ((uVar9 & 0x30) == 0x30) {
        sqlite3_str_appendf((StrAccum *)local_c8,">? AND %s","rowid");
        uVar9 = 0x3c;
      }
      else {
        uVar9 = (uVar9 & 0x20) >> 4 | 0x3c;
      }
    }
    else {
      uVar9 = 0x3d;
    }
    sqlite3_str_appendf((StrAccum *)local_c8,"%c?)",uVar9);
  }
LAB_0018e9e3:
  if ((pTabList->a[bVar1].fg.jointype & 8) != 0) {
    sqlite3_str_appendf((StrAccum *)local_c8," LEFT-JOIN");
  }
  sqlite3DbFree(db,(pOVar10->p4).p);
  pOVar10->p4type = -6;
  pcVar8 = sqlite3StrAccumFinish((StrAccum *)local_c8);
  (pOVar10->p4).z = pcVar8;
LAB_0018ea25:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereAddExplainText(
  Parse *pParse,                  /* Parse context */
  int addr,                       /* Address of OP_Explain opcode */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
#if !defined(SQLITE_DEBUG)
  if( sqlite3ParseToplevel(pParse)->explain==2 || IS_STMT_SCANSTATUS(pParse->db) )
#endif
  {
    VdbeOp *pOp = sqlite3VdbeGetOp(pParse->pVdbe, addr);

    SrcItem *pItem = &pTabList->a[pLevel->iFrom];
    sqlite3 *db = pParse->db;     /* Database handle */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */
    WhereLoop *pLoop;             /* The controlling WhereLoop object */
    u32 flags;                    /* Flags that describe this loop */
#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_EXPLAIN)
    char *zMsg;                   /* Text to add to EQP output */
#endif
    StrAccum str;                 /* EQP output string */
    char zBuf[100];               /* Initial space for EQP output string */

    if( db->mallocFailed ) return;

    pLoop = pLevel->pWLoop;
    flags = pLoop->wsFlags;

    isSearch = (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
            || ((flags&WHERE_VIRTUALTABLE)==0 && (pLoop->u.btree.nEq>0))
            || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
    str.printfFlags = SQLITE_PRINTF_INTERNAL;
    sqlite3_str_appendf(&str, "%s %S", isSearch ? "SEARCH" : "SCAN", pItem);
    if( (flags & (WHERE_IPK|WHERE_VIRTUALTABLE))==0 ){
      const char *zFmt = 0;
      Index *pIdx;

      assert( pLoop->u.btree.pIndex!=0 );
      pIdx = pLoop->u.btree.pIndex;
      assert( !(flags&WHERE_AUTO_INDEX) || (flags&WHERE_IDX_ONLY) );
      if( !HasRowid(pItem->pSTab) && IsPrimaryKeyIndex(pIdx) ){
        if( isSearch ){
          zFmt = "PRIMARY KEY";
        }
      }else if( flags & WHERE_PARTIALIDX ){
        zFmt = "AUTOMATIC PARTIAL COVERING INDEX";
      }else if( flags & WHERE_AUTO_INDEX ){
        zFmt = "AUTOMATIC COVERING INDEX";
      }else if( flags & (WHERE_IDX_ONLY|WHERE_EXPRIDX) ){
        zFmt = "COVERING INDEX %s";
      }else{
        zFmt = "INDEX %s";
      }
      if( zFmt ){
        sqlite3_str_append(&str, " USING ", 7);
        sqlite3_str_appendf(&str, zFmt, pIdx->zName);
        explainIndexRange(&str, pLoop);
      }
    }else if( (flags & WHERE_IPK)!=0 && (flags & WHERE_CONSTRAINT)!=0 ){
      char cRangeOp;
#if 0  /* Better output, but breaks many tests */
      const Table *pTab = pItem->pTab;
      const char *zRowid = pTab->iPKey>=0 ? pTab->aCol[pTab->iPKey].zCnName:
                              "rowid";
#else
      const char *zRowid = "rowid";
#endif
      sqlite3_str_appendf(&str, " USING INTEGER PRIMARY KEY (%s", zRowid);
      if( flags&(WHERE_COLUMN_EQ|WHERE_COLUMN_IN) ){
        cRangeOp = '=';
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        sqlite3_str_appendf(&str, ">? AND %s", zRowid);
        cRangeOp = '<';
      }else if( flags&WHERE_BTM_LIMIT ){
        cRangeOp = '>';
      }else{
        assert( flags&WHERE_TOP_LIMIT);
        cRangeOp = '<';
      }
      sqlite3_str_appendf(&str, "%c?)", cRangeOp);
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_str_appendall(&str, " VIRTUAL TABLE INDEX ");
      sqlite3_str_appendf(&str,
                  pLoop->u.vtab.bIdxNumHex ? "0x%x:%s" : "%d:%s",
                  pLoop->u.vtab.idxNum, pLoop->u.vtab.idxStr);
    }
#endif
    if( pItem->fg.jointype & JT_LEFT ){
      sqlite3_str_appendf(&str, " LEFT-JOIN");
    }
#ifdef SQLITE_EXPLAIN_ESTIMATED_ROWS
    if( pLoop->nOut>=10 ){
      sqlite3_str_appendf(&str, " (~%llu rows)",
             sqlite3LogEstToInt(pLoop->nOut));
    }else{
      sqlite3_str_append(&str, " (~1 row)", 9);
    }
#endif
#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_EXPLAIN)
    zMsg = sqlite3StrAccumFinish(&str);
    sqlite3ExplainBreakpoint("",zMsg);
#endif

    assert( pOp->opcode==OP_Explain );
    assert( pOp->p4type==P4_DYNAMIC || pOp->p4.z==0 );
    sqlite3DbFree(db, pOp->p4.z);
    pOp->p4type = P4_DYNAMIC;
    pOp->p4.z = sqlite3StrAccumFinish(&str);
  }
}